

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void soul::SanityCheckPass::throwErrorIfNotReadableValue(Expression *e)

{
  bool bVar1;
  int iVar2;
  InputEndpointRef *pIVar3;
  EndpointDetails *pEVar4;
  pool_ptr<soul::AST::InputEndpointRef> input;
  pool_ptr<soul::AST::InputEndpointRef> local_f8;
  CompileMessage local_f0;
  CompileMessage local_b8;
  CompileMessage local_80;
  CompileMessage local_48;
  
  if (e->kind == value) {
    iVar2 = (*(e->super_Statement).super_ASTObject._vptr_ASTObject[3])(e);
    if ((char)iVar2 != '\0') {
      return;
    }
  }
  bVar1 = is_type<soul::AST::OutputEndpointRef,soul::AST::Expression>(e);
  if (bVar1) {
    Errors::cannotReadFromOutput<>();
    AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_48,false);
  }
  cast<soul::AST::InputEndpointRef,soul::AST::Expression>((soul *)&local_f8,e);
  if (local_f8.object != (InputEndpointRef *)0x0) {
    pIVar3 = pool_ptr<soul::AST::InputEndpointRef>::operator->(&local_f8);
    iVar2 = (*(pIVar3->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])(pIVar3)
    ;
    if ((char)iVar2 != '\0') {
      pIVar3 = pool_ptr<soul::AST::InputEndpointRef>::operator->(&local_f8);
      pEVar4 = pool_ptr<soul::AST::EndpointDetails>::operator*(&((pIVar3->input).object)->details);
      if (pEVar4->endpointType == event) {
        Errors::cannotReadFromEventInput<>();
        AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_f0,false);
      }
    }
  }
  bVar1 = is_type<soul::AST::ProcessorRef,soul::AST::Expression>(e);
  if (!bVar1) {
    bVar1 = is_type<soul::AST::ProcessorInstanceRef,soul::AST::Expression>(e);
    if (!bVar1) {
      Errors::expectedValue<>();
      AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_b8,false);
    }
  }
  Errors::cannotUseProcessorAsValue<>();
  AST::Context::throwError(&(e->super_Statement).super_ASTObject.context,&local_80,false);
}

Assistant:

static void throwErrorIfNotReadableValue (AST::Expression& e)
    {
        if (! AST::isResolvedAsValue (e))
        {
            if (is_type<AST::OutputEndpointRef> (e))
                e.context.throwError (Errors::cannotReadFromOutput());

            if (auto input = cast<AST::InputEndpointRef> (e))
                if (input->isResolved())
                    if (isEvent (input->input->getDetails()))
                        e.context.throwError (Errors::cannotReadFromEventInput());

            if (is_type<AST::ProcessorRef> (e) || is_type<AST::ProcessorInstanceRef> (e))
                e.context.throwError (Errors::cannotUseProcessorAsValue());

            e.context.throwError (Errors::expectedValue());
        }
    }